

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFile.cc
# Opt level: O3

void __thiscall avro::DataFileReaderBase::readHeader(DataFileReaderBase *this)

{
  Metadata *this_00;
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  element_type *peVar3;
  shared_count sVar4;
  undefined8 uVar5;
  int iVar6;
  iterator iVar7;
  undefined8 *puVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *v;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *v_00;
  sp_counted_base *extraout_RDX;
  sp_counted_base *extraout_RDX_00;
  sp_counted_base *psVar9;
  _Base_ptr this_01;
  bool bVar10;
  undefined1 auVar11 [16];
  Magic m;
  istringstream iss;
  string local_1f0;
  array<unsigned_char,_4UL> local_1cc;
  element_type *local_1c8;
  shared_count sStack_1c0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [6];
  ios_base local_140 [272];
  
  peVar2 = (this->decoder_).px;
  (*peVar2->_vptr_Decoder[2])(peVar2,(this->stream_)._M_ptr);
  codec_traits<boost::array<unsigned_char,_4UL>_>::decode((this->decoder_).px,&local_1cc);
  if (magic != local_1cc.elems) {
    puVar8 = (undefined8 *)__cxa_allocate_exception(0x18);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                   "Invalid data file. Magic does not match: ",&this->filename_);
    std::runtime_error::runtime_error((runtime_error *)(puVar8 + 1),(string *)local_1b8);
    *puVar8 = 0x1cc910;
    puVar8[1] = 0x1cc940;
    __cxa_throw(puVar8,&Exception::typeinfo,Exception::~Exception);
  }
  this_00 = &this->metadata_;
  codec_traits<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  ::decode((this->decoder_).px,this_00);
  iVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ::find(&this_00->_M_t,(key_type *)(anonymous_namespace)::AVRO_SCHEMA_KEY_abi_cxx11_);
  p_Var1 = &(this->metadata_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar7._M_node != p_Var1) {
    toString_abi_cxx11_(&local_1f0,(avro *)(iVar7._M_node + 2),v);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_1b8,(string *)&local_1f0,_S_in);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    ValidSchema::ValidSchema((ValidSchema *)&local_1f0);
    compileJsonSchema((istream *)local_1b8,(ValidSchema *)&local_1f0);
    local_1c8 = (element_type *)local_1f0._M_dataplus._M_p;
    sStack_1c0.pi_ = (sp_counted_base *)local_1f0._M_string_length;
    if ((sp_counted_base *)local_1f0._M_string_length != (sp_counted_base *)0x0) {
      LOCK();
      *(uint_least32_t *)(local_1f0._M_string_length + 8) =
           *(uint_least32_t *)(local_1f0._M_string_length + 8) + 1;
      UNLOCK();
    }
    boost::detail::shared_count::~shared_count((shared_count *)&local_1f0._M_string_length);
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1b8);
    std::ios_base::~ios_base(local_140);
    sVar4.pi_ = sStack_1c0.pi_;
    peVar3 = local_1c8;
    local_1c8 = (element_type *)0x0;
    sStack_1c0.pi_ = (sp_counted_base *)0x0;
    local_1b8._0_8_ = (this->dataSchema_).root_.px;
    local_1b8._8_8_ = (this->dataSchema_).root_.pn.pi_;
    (this->dataSchema_).root_.px = peVar3;
    (this->dataSchema_).root_.pn.pi_ = sVar4.pi_;
    boost::detail::shared_count::~shared_count((shared_count *)(local_1b8 + 8));
    boost::detail::shared_count::~shared_count(&sStack_1c0);
    if ((this->readerSchema_).root_.px == (element_type *)0x0) {
      boost::shared_ptr<avro::Node>::operator=
                (&(this->readerSchema_).root_,&(this->dataSchema_).root_);
    }
    iVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            ::find(&this_00->_M_t,(key_type *)(anonymous_namespace)::AVRO_CODEC_KEY_abi_cxx11_);
    if ((_Rb_tree_header *)iVar7._M_node == p_Var1) {
      this->codec_ = NULL_CODEC;
    }
    else {
      this_01 = iVar7._M_node + 2;
      toString_abi_cxx11_((string *)local_1b8,(avro *)this_01,v_00);
      uVar5 = local_1b8._0_8_;
      psVar9 = (sp_counted_base *)local_1b8._8_8_;
      if ((sp_counted_base *)local_1b8._8_8_ == _DAT_001d53b8) {
        if ((sp_counted_base *)local_1b8._8_8_ == (sp_counted_base *)0x0) {
          bVar10 = true;
        }
        else {
          iVar6 = bcmp((void *)local_1b8._0_8_,(anonymous_namespace)::AVRO_DEFLATE_CODEC_abi_cxx11_,
                       local_1b8._8_8_);
          bVar10 = iVar6 == 0;
          psVar9 = extraout_RDX;
        }
      }
      else {
        bVar10 = false;
      }
      if ((element_type *)uVar5 != (element_type *)(local_1b8 + 0x10)) {
        operator_delete((void *)uVar5,local_1a8[0]._M_allocated_capacity + 1);
        psVar9 = extraout_RDX_00;
      }
      if (bVar10) {
        this->codec_ = DEFLATE_CODEC;
      }
      else {
        this->codec_ = NULL_CODEC;
        toString_abi_cxx11_((string *)local_1b8,(avro *)this_01,
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)psVar9);
        uVar5 = local_1b8._0_8_;
        if ((sp_counted_base *)local_1b8._8_8_ == _DAT_001d5398) {
          if ((sp_counted_base *)local_1b8._8_8_ == (sp_counted_base *)0x0) {
            bVar10 = false;
          }
          else {
            iVar6 = bcmp((void *)local_1b8._0_8_,(anonymous_namespace)::AVRO_NULL_CODEC_abi_cxx11_,
                         local_1b8._8_8_);
            bVar10 = iVar6 != 0;
          }
        }
        else {
          bVar10 = true;
        }
        if ((element_type *)uVar5 != (element_type *)(local_1b8 + 0x10)) {
          operator_delete((void *)uVar5,local_1a8[0]._M_allocated_capacity + 1);
        }
        if (bVar10) {
          auVar11 = __cxa_allocate_exception(0x18);
          puVar8 = auVar11._0_8_;
          toString_abi_cxx11_(&local_1f0,(avro *)this_01,auVar11._8_8_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1b8,"Unknown codec in data file: ",&local_1f0);
          std::runtime_error::runtime_error((runtime_error *)(puVar8 + 1),(string *)local_1b8);
          *puVar8 = 0x1cc910;
          puVar8[1] = 0x1cc940;
          __cxa_throw(puVar8,&Exception::typeinfo,Exception::~Exception);
        }
      }
    }
    codec_traits<boost::array<unsigned_char,_16UL>_>::decode((this->decoder_).px,&this->sync_);
    return;
  }
  puVar8 = (undefined8 *)__cxa_allocate_exception(0x18);
  local_1b8._0_8_ = local_1b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"No schema in metadata","");
  std::runtime_error::runtime_error((runtime_error *)(puVar8 + 1),(string *)local_1b8);
  *puVar8 = 0x1cc910;
  puVar8[1] = 0x1cc940;
  __cxa_throw(puVar8,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void DataFileReaderBase::readHeader()
{
    decoder_->init(*stream_);
    Magic m;
    avro::decode(*decoder_, m);
    if (magic != m) {
        throw Exception("Invalid data file. Magic does not match: "
            + filename_);
    }
    avro::decode(*decoder_, metadata_);
    Metadata::const_iterator it = metadata_.find(AVRO_SCHEMA_KEY);
    if (it == metadata_.end()) {
        throw Exception("No schema in metadata");
    }

    dataSchema_ = makeSchema(it->second);
    if (! readerSchema_.root()) {
        readerSchema_ = dataSchema();
    }

    it = metadata_.find(AVRO_CODEC_KEY);
    if (it != metadata_.end() && toString(it->second) == AVRO_DEFLATE_CODEC) {
        codec_ = DEFLATE_CODEC;
    } else {
        codec_ = NULL_CODEC;
        if (it != metadata_.end() && toString(it->second) != AVRO_NULL_CODEC) {
            throw Exception("Unknown codec in data file: " + toString(it->second));
        }
    }

    avro::decode(*decoder_, sync_);
}